

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

fp fmt::v5::internal::operator*(fp x,fp y)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  fp fVar6;
  
  uVar1 = x.f & 0xffffffff;
  uVar4 = x.f >> 0x20;
  uVar2 = y.f >> 0x20;
  uVar3 = uVar2 * uVar1;
  uVar5 = uVar4 * (uint)y.f;
  fVar6.f = ((uVar3 & 0xffffffff) + (uVar5 & 0xffffffff) + ((uint)y.f * uVar1 >> 0x20) + 0x80000000
            >> 0x20) + (uVar3 >> 0x20) + (uVar5 >> 0x20) + uVar2 * uVar4;
  fVar6.e = x.e + y.e + 0x40;
  fVar6._12_4_ = 0;
  return fVar6;
}

Assistant:

FMT_FUNC fp operator*(fp x, fp y) {
  // Multiply 32-bit parts of significands.
  uint64_t mask = (1ULL << 32) - 1;
  uint64_t a = x.f >> 32, b = x.f & mask;
  uint64_t c = y.f >> 32, d = y.f & mask;
  uint64_t ac = a * c, bc = b * c, ad = a * d, bd = b * d;
  // Compute mid 64-bit of result and round.
  uint64_t mid = (bd >> 32) + (ad & mask) + (bc & mask) + (1U << 31);
  return fp(ac + (ad >> 32) + (bc >> 32) + (mid >> 32), x.e + y.e + 64);
}